

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.h
# Opt level: O0

void __thiscall ArgParser::ArgIterator::setcurrent(ArgIterator *this)

{
  char *pcVar1;
  size_t sVar2;
  ArgIterator *this_local;
  
  this->longmatch = false;
  this->isoption = false;
  if (this->i == this->argc) {
    this->pend = (char *)0x0;
    this->p = (char *)0x0;
  }
  else {
    this->p = this->argv[this->i];
    pcVar1 = this->p;
    sVar2 = stringlength<char>(this->p);
    this->pend = pcVar1 + sVar2;
  }
  return;
}

Assistant:

void setcurrent()
        {
            longmatch = false;
            isoption = false;
            if (i==argc) {
                p = pend = nullptr;
                return;
            }
            p = argv[i];
            pend = p + stringlength(p);
        }